

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

Abc_Ntk_t *
Abc_SclBufPerform(Abc_Ntk_t *pNtk,int FanMin,int FanMax,int fBufPis,int fSkipDup,int fVerbose)

{
  int iVar1;
  Buf_Man_t *p_00;
  Abc_Ntk_t *p_01;
  bool bVar2;
  int local_3c;
  int Limit;
  int i;
  Buf_Man_t *p;
  Abc_Ntk_t *pNew;
  int fVerbose_local;
  int fSkipDup_local;
  int fBufPis_local;
  int FanMax_local;
  int FanMin_local;
  Abc_Ntk_t *pNtk_local;
  
  p_00 = Buf_ManStart(pNtk,FanMin,FanMax,fBufPis);
  Abc_NtkLevel(pNtk);
  local_3c = 0;
  while( true ) {
    bVar2 = false;
    if (local_3c < 1000000000) {
      iVar1 = Vec_QueSize(p_00->vQue);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    iVar1 = Vec_QuePop(p_00->vQue);
    Abc_BufPerformOne(p_00,iVar1,fSkipDup,fVerbose);
    local_3c = local_3c + 1;
  }
  Buf_ManStop(p_00);
  p_01 = Abc_NtkDupDfs(pNtk);
  Abc_SclCheckNtk(p_01,fVerbose);
  return p_01;
}

Assistant:

Abc_Ntk_t * Abc_SclBufPerform( Abc_Ntk_t * pNtk, int FanMin, int FanMax, int fBufPis, int fSkipDup, int fVerbose )
{
    Abc_Ntk_t * pNew;
    Buf_Man_t * p = Buf_ManStart( pNtk, FanMin, FanMax, fBufPis );
    int i, Limit = ABC_INFINITY;
    Abc_NtkLevel( pNtk );
//    if ( Abc_NtkNodeNum(pNtk) < 1000 )
//        fSkipDup = 1;
    for ( i = 0; i < Limit && Vec_QueSize(p->vQue); i++ )
        Abc_BufPerformOne( p, Vec_QuePop(p->vQue), fSkipDup, fVerbose );
    Buf_ManStop( p );
//    Abc_BufReplaceBufsByInvs( pNtk );
    // duplicate network in topo order
    pNew = Abc_NtkDupDfs( pNtk );
    Abc_SclCheckNtk( pNew, fVerbose );
    return pNew;
}